

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O1

void __thiscall
Assimp::BlenderImporter::BuildMaterials(BlenderImporter *this,ConversionData *conv_data)

{
  char *__s;
  pointer *pppaVar1;
  float fVar2;
  _Map_pointer ppsVar3;
  Material *source;
  iterator __position;
  MTex *tex;
  undefined1 *puVar4;
  BlenderImporter *pBVar5;
  size_t sVar6;
  Material *extraout_RDX;
  Material *extraout_RDX_00;
  Material *mat;
  ulong __n;
  long lVar7;
  aiMaterial *mout;
  aiColor3D emit_col;
  aiColor3D col;
  aiString name;
  BlenderImporter *local_4a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4a0;
  float local_494;
  float local_490;
  float local_48c;
  undefined1 *local_488;
  float local_480;
  undefined1 local_478 [16];
  _Map_pointer local_468;
  _Elt_pointer local_460;
  vector<aiMaterial*,std::allocator<aiMaterial*>> *local_458;
  uint *local_450;
  _Elt_pointer local_448;
  _Elt_pointer local_440;
  aiString local_434;
  
  ppsVar3 = (conv_data->materials_raw).
            super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  pBVar5 = (BlenderImporter *)&conv_data->materials;
  local_458 = (vector<aiMaterial*,std::allocator<aiMaterial*>> *)pBVar5;
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::reserve
            ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)pBVar5,
             ((long)(conv_data->materials_raw).
                    super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)(conv_data->materials_raw).
                    super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
             ((long)(conv_data->materials_raw).
                    super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)(conv_data->materials_raw).
                    super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)ppsVar3 -
                       (long)(conv_data->materials_raw).
                             super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(ppsVar3 == (_Map_pointer)0x0)) * 0x20);
  BuildDefaultMaterial(pBVar5,conv_data);
  local_440 = (conv_data->materials_raw).
              super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_448 = (conv_data->materials_raw).
              super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_440 != local_448) {
    local_460 = (conv_data->materials_raw).
                super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last;
    local_468 = (conv_data->materials_raw).
                super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
    local_450 = conv_data->next_texture;
    do {
      source = (local_440->super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      local_4a0 = (local_440->
                  super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
      if (local_4a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_4a0->_M_use_count = local_4a0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_4a0->_M_use_count = local_4a0->_M_use_count + 1;
        }
      }
      local_450[0xf] = 0;
      local_450[0x10] = 0;
      local_450[0x11] = 0;
      local_450[0x12] = 0;
      local_450[0xc] = 0;
      local_450[0xd] = 0;
      local_450[0xe] = 0;
      local_450[0xf] = 0;
      local_450[8] = 0;
      local_450[9] = 0;
      local_450[10] = 0;
      local_450[0xb] = 0;
      local_450[4] = 0;
      local_450[5] = 0;
      local_450[6] = 0;
      local_450[7] = 0;
      local_450[0] = 0;
      local_450[1] = 0;
      local_450[2] = 0;
      local_450[3] = 0;
      pBVar5 = (BlenderImporter *)operator_new(0x10);
      aiMaterial::aiMaterial((aiMaterial *)pBVar5);
      __position._M_current =
           (conv_data->materials).arr.
           super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_4a8 = pBVar5;
      if (__position._M_current ==
          (conv_data->materials).arr.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiMaterial*,std::allocator<aiMaterial*>>::_M_realloc_insert<aiMaterial*const&>
                  (local_458,__position,(aiMaterial **)&local_4a8);
      }
      else {
        *__position._M_current = (aiMaterial *)pBVar5;
        pppaVar1 = &(conv_data->materials).arr.
                    super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppaVar1 = *pppaVar1 + 1;
      }
      __s = (source->id).name + 2;
      local_488 = local_478;
      sVar6 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_488,__s,(source->id).name + sVar6 + 2);
      puVar4 = local_488;
      __n = (ulong)(uint)local_480;
      if (((uint)local_480 & 0xfffffc00) != 0) {
        __n = 0x3ff;
      }
      local_434.length = (ai_uint32)__n;
      memcpy(local_434.data,local_488,__n);
      local_434.data[__n] = '\0';
      if (puVar4 != local_478) {
        operator_delete(puVar4);
      }
      aiMaterial::AddProperty((aiMaterial *)local_4a8,&local_434,"?mat.name",0,0);
      local_488._0_4_ = source->r;
      local_488._4_4_ = source->g;
      local_480 = source->b;
      if (((((source->r != 0.0) || (NAN(source->r))) || (source->g != 0.0)) ||
          ((NAN(source->g) || (local_480 != 0.0)))) || (NAN(local_480))) {
        aiMaterial::AddBinaryProperty
                  ((aiMaterial *)local_4a8,(string *)&local_488,0xc,"$clr.diffuse",0,0,aiPTI_Float);
        fVar2 = source->emit;
        if ((fVar2 != 0.0) || (NAN(fVar2))) {
          local_494 = source->r * fVar2;
          local_490 = source->g * fVar2;
          local_48c = fVar2 * source->b;
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)local_4a8,&local_494,0xc,"$clr.emissive",0,0,aiPTI_Float);
        }
      }
      local_488._0_4_ = source->specr;
      local_488._4_4_ = source->specg;
      local_480 = source->specb;
      aiMaterial::AddBinaryProperty
                ((aiMaterial *)local_4a8,(string *)&local_488,0xc,"$clr.specular",0,0,aiPTI_Float);
      if (source->har != 0) {
        local_494 = (float)(int)source->har;
        aiMaterial::AddBinaryProperty
                  ((aiMaterial *)local_4a8,&local_494,4,"$mat.shininess",0,0,aiPTI_Float);
      }
      local_488._0_4_ = source->ambr;
      local_488._4_4_ = source->ambg;
      local_480 = source->ambb;
      aiMaterial::AddBinaryProperty
                ((aiMaterial *)local_4a8,(string *)&local_488,0xc,"$clr.ambient",0,0,aiPTI_Float);
      if ((source->mode & 0x40000) != 0) {
        local_494 = source->ray_mirror;
        aiMaterial::AddBinaryProperty
                  ((aiMaterial *)local_4a8,&local_494,4,"$mat.reflectivity",0,0,aiPTI_Float);
      }
      local_488._0_4_ = source->mirr;
      local_488._4_4_ = source->mirg;
      local_480 = source->mirb;
      pBVar5 = local_4a8;
      aiMaterial::AddBinaryProperty
                ((aiMaterial *)local_4a8,(string *)&local_488,0xc,"$clr.reflective",0,0,aiPTI_Float)
      ;
      lVar7 = 0x598;
      mat = extraout_RDX;
      do {
        tex = *(MTex **)((source->id).name + lVar7 + -0x20);
        if (tex != (MTex *)0x0) {
          ResolveTexture(pBVar5,(aiMaterial *)local_4a8,mat,tex,conv_data);
          mat = extraout_RDX_00;
        }
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x6b8);
      AddBlendParams(pBVar5,(aiMaterial *)local_4a8,source);
      if (local_4a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a0);
      }
      local_440 = local_440 + 1;
      if (local_440 == local_460) {
        local_440 = local_468[1];
        local_468 = local_468 + 1;
        local_460 = local_440 + 0x20;
      }
    } while (local_440 != local_448);
  }
  return;
}

Assistant:

void BlenderImporter::BuildMaterials(ConversionData& conv_data)
{
    conv_data.materials->reserve(conv_data.materials_raw.size());

    BuildDefaultMaterial(conv_data);

    for(std::shared_ptr<Material> mat : conv_data.materials_raw) {

        // reset per material global counters
        for (size_t i = 0; i < sizeof(conv_data.next_texture)/sizeof(conv_data.next_texture[0]);++i) {
            conv_data.next_texture[i] = 0 ;
        }

        aiMaterial* mout = new aiMaterial();
        conv_data.materials->push_back(mout);
        // For any new material field handled here, the default material above must be updated with an appropriate default value.

        // set material name
        aiString name = aiString(mat->id.name+2); // skip over the name prefix 'MA'
        mout->AddProperty(&name,AI_MATKEY_NAME);

        // basic material colors
        aiColor3D col(mat->r,mat->g,mat->b);
        if (mat->r || mat->g || mat->b ) {

            // Usually, zero diffuse color means no diffuse color at all in the equation.
            // So we omit this member to express this intent.
            mout->AddProperty(&col,1,AI_MATKEY_COLOR_DIFFUSE);

            if (mat->emit) {
                aiColor3D emit_col(mat->emit * mat->r, mat->emit * mat->g, mat->emit * mat->b) ;
                mout->AddProperty(&emit_col, 1, AI_MATKEY_COLOR_EMISSIVE) ;
            }
        }

        col = aiColor3D(mat->specr,mat->specg,mat->specb);
        mout->AddProperty(&col,1,AI_MATKEY_COLOR_SPECULAR);

        // is hardness/shininess set?
        if( mat->har ) {
            const float har = mat->har;
            mout->AddProperty(&har,1,AI_MATKEY_SHININESS);
        }

        col = aiColor3D(mat->ambr,mat->ambg,mat->ambb);
        mout->AddProperty(&col,1,AI_MATKEY_COLOR_AMBIENT);

        // is mirror enabled?
        if( mat->mode & MA_RAYMIRROR ) {
            const float ray_mirror = mat->ray_mirror;
            mout->AddProperty(&ray_mirror,1,AI_MATKEY_REFLECTIVITY);
        }

        col = aiColor3D(mat->mirr,mat->mirg,mat->mirb);
        mout->AddProperty(&col,1,AI_MATKEY_COLOR_REFLECTIVE);

        for(size_t i = 0; i < sizeof(mat->mtex) / sizeof(mat->mtex[0]); ++i) {
            if (!mat->mtex[i]) {
                continue;
            }

            ResolveTexture(mout,mat.get(),mat->mtex[i].get(),conv_data);
        }

        AddBlendParams(mout, mat.get());
    }
}